

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int cmd_setroot(char *args)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  if (*args == '\"') {
    args = args + 1;
    pcVar2 = strchr(args,0x22);
    if (pcVar2 != (char *)0x0) goto LAB_0010525c;
LAB_0010529d:
    pcVar2 = "missing string terminator in argument.";
  }
  else {
    pcVar2 = strchr(args,0x20);
LAB_0010525c:
    *pcVar2 = '\0';
    if (pcVar2[1] == '\"') {
      pcVar2 = pcVar2 + 2;
      pcVar3 = strchr(pcVar2,0x22);
      if (pcVar3 == (char *)0x0) goto LAB_0010529d;
      *pcVar3 = '\0';
    }
    else {
      pcVar2 = pcVar2 + 1;
    }
    iVar1 = PHYSFS_setRoot(args,pcVar2);
    if (iVar1 == 0) {
      uVar4 = PHYSFS_getLastError();
      printf("Failure. reason: %s.\n",uVar4);
      return 1;
    }
    pcVar2 = "Successful.";
  }
  puts(pcVar2);
  return 1;
}

Assistant:

static int cmd_setroot(char *args)
{
    char *archive;
    char *subdir;
    char *ptr;

    archive = args;
    if (*archive == '\"')
    {
        archive++;
        ptr = strchr(archive, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(archive, ' ');
        *ptr = '\0';
    } /* else */

    subdir = ptr + 1;
    if (*subdir == '\"')
    {
        subdir++;
        ptr = strchr(subdir, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */

    if (PHYSFS_setRoot(archive, subdir))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}